

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comm.c
# Opt level: O0

void bust_a_prompt(CHAR_DATA *ch)

{
  char cVar1;
  short sVar2;
  short sVar3;
  uint uVar4;
  ulong uVar5;
  bool bVar6;
  int iVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  CHAR_DATA *in_RDI;
  __type_conflict2 _Var11;
  DESCRIPTOR_DATA *d;
  int door;
  char *dir_name [6];
  bool found;
  int number_people;
  EXIT_DATA *pexit;
  char doors [4608];
  char *point;
  char *i;
  char *orig;
  char *str;
  char buf3 [4608];
  char buf2 [4608];
  char buf [4608];
  CHAR_DATA *in_stack_ffffffffffffb6a8;
  undefined4 in_stack_ffffffffffffb6b0;
  int in_stack_ffffffffffffb6b4;
  char *in_stack_ffffffffffffb6b8;
  undefined4 in_stack_ffffffffffffb6c0;
  uint in_stack_ffffffffffffb6c4;
  char *in_stack_ffffffffffffb6c8;
  undefined4 in_stack_ffffffffffffb6d0;
  uint in_stack_ffffffffffffb6d4;
  CHAR_DATA *ch_00;
  char *local_4910;
  char *local_48f8;
  uint local_48e4;
  DESCRIPTOR_DATA *local_4878;
  int local_486c;
  undefined8 local_4868 [6];
  byte local_4835;
  uint local_4834;
  EXIT_DATA *local_4830;
  char local_4828 [4608];
  char *local_3628;
  CHAR_DATA *local_3620;
  char *local_3618;
  char *local_3610;
  char local_3608 [4608];
  CHAR_DATA local_2408 [5];
  char local_1208 [4608];
  CHAR_DATA *local_8;
  
  local_3620 = (CHAR_DATA *)0x0;
  local_8 = in_RDI;
  memcpy(local_4868,&DAT_008da130,0x30);
  local_3628 = local_1208;
  bVar6 = is_npc(in_stack_ffffffffffffb6a8);
  if ((((bVar6) || (bVar6 = str_cmp(local_8->prompt,""), !bVar6)) ||
      (bVar6 = str_cmp(local_8->prompt,"<%hhp %mm %vmv> "), !bVar6)) ||
     (bVar6 = str_cmp(local_8->prompt,"<%hhp %mm %vmv>"), !bVar6)) {
    pcVar8 = get_char_color((CHAR_DATA *)in_stack_ffffffffffffb6c8,
                            (char *)CONCAT44(in_stack_ffffffffffffb6c4,in_stack_ffffffffffffb6c0));
    uVar4 = local_8->hit;
    sVar2 = local_8->mana;
    sVar3 = local_8->move;
    pcVar9 = END_COLOR((CHAR_DATA *)in_stack_ffffffffffffb6b8);
    sprintf(local_1208,"%s<%dhp %dm %dmv>%s ",pcVar8,(ulong)uVar4,(ulong)(uint)(int)sVar2,
            (ulong)(uint)(int)sVar3,pcVar9);
    send_to_char((char *)CONCAT44(in_stack_ffffffffffffb6c4,in_stack_ffffffffffffb6c0),
                 (CHAR_DATA *)in_stack_ffffffffffffb6b8);
  }
  else {
    uVar5 = local_8->comm[0];
    _Var11 = std::pow<int,int>(0,0x5af0dd);
    if ((uVar5 & (long)_Var11) != 0) {
      send_to_char((char *)CONCAT44(in_stack_ffffffffffffb6c4,in_stack_ffffffffffffb6c0),
                   (CHAR_DATA *)in_stack_ffffffffffffb6b8);
    }
    pcVar9 = get_char_color((CHAR_DATA *)in_stack_ffffffffffffb6c8,
                            (char *)CONCAT44(in_stack_ffffffffffffb6c4,in_stack_ffffffffffffb6c0));
    pcVar8 = local_8->prompt;
    pcVar10 = END_COLOR((CHAR_DATA *)in_stack_ffffffffffffb6b8);
    sprintf((char *)local_2408,"%s%s%s",pcVar9,pcVar8,pcVar10);
    strcpy(local_3608,(char *)local_2408);
    local_3618 = local_3608;
    local_3610 = local_3618;
    while (*local_3610 != '\0') {
      if (*local_3610 == '%') {
        local_3610 = local_3610 + 1;
        switch(*local_3610) {
        case '%':
          sprintf((char *)local_2408,"%%");
          local_3620 = local_2408;
          break;
        default:
          local_3620 = (CHAR_DATA *)0x7bd85a;
          break;
        case '1':
          if (local_8->max_hit == 0) {
            sprintf((char *)local_2408,"0%%");
          }
          else {
            sprintf((char *)local_2408,"%d%s",
                    (long)(local_8->hit * 100) / (long)(int)local_8->max_hit & 0xffffffff,"%");
          }
          local_3620 = local_2408;
          break;
        case '2':
          if (local_8->max_mana == 0) {
            sprintf((char *)local_2408,"0%%");
          }
          else {
            sprintf((char *)local_2408,"%d%s",
                    (long)(local_8->mana * 100) / (long)(int)local_8->max_mana & 0xffffffff,"%");
          }
          local_3620 = local_2408;
          break;
        case '3':
          if (local_8->max_move == 0) {
            sprintf((char *)local_2408,"0%%");
          }
          else {
            sprintf((char *)local_2408,"%d%s",
                    (long)(local_8->move * 100) / (long)(int)local_8->max_move & 0xffffffff,"%");
          }
          local_3620 = local_2408;
          break;
        case 'C':
          bVar6 = is_immortal(in_stack_ffffffffffffb6a8);
          if (bVar6) {
            local_4834 = 0;
            for (local_4878 = descriptor_list; local_4878 != (DESCRIPTOR_DATA *)0x0;
                local_4878 = local_4878->next) {
              if ((local_4878->connected == 0) &&
                 (bVar6 = can_see((CHAR_DATA *)in_stack_ffffffffffffb6c8,
                                  (CHAR_DATA *)
                                  CONCAT44(in_stack_ffffffffffffb6c4,in_stack_ffffffffffffb6c0)),
                 bVar6)) {
                local_4834 = local_4834 + 1;
              }
            }
            sprintf((char *)local_2408,"%i",(ulong)local_4834);
          }
          else {
            sprintf((char *)local_2408," ");
          }
          local_3620 = local_2408;
          break;
        case 'H':
          sprintf((char *)local_2408,"%d",(ulong)(uint)(int)local_8->max_hit);
          local_3620 = local_2408;
          break;
        case 'L':
          if (local_8->wait < 2) {
            sprintf((char *)local_2408,"-");
          }
          else {
            sprintf((char *)local_2408,"+");
          }
          local_3620 = local_2408;
          break;
        case 'M':
          sprintf((char *)local_2408,"%d",(ulong)(uint)(int)local_8->max_mana);
          local_3620 = local_2408;
          break;
        case 'P':
          bVar6 = is_immortal(in_stack_ffffffffffffb6a8);
          if ((bVar6) && (local_8->in_room != (ROOM_INDEX_DATA *)0x0)) {
            local_4834 = 0;
            for (local_4878 = descriptor_list; local_4878 != (DESCRIPTOR_DATA *)0x0;
                local_4878 = local_4878->next) {
              if ((((local_4878->connected == 0) &&
                   (local_4878->character->in_room != (ROOM_INDEX_DATA *)0x0)) &&
                  (local_4878->character->in_room->area == local_8->in_room->area)) &&
                 (bVar6 = can_see((CHAR_DATA *)in_stack_ffffffffffffb6c8,
                                  (CHAR_DATA *)
                                  CONCAT44(in_stack_ffffffffffffb6c4,in_stack_ffffffffffffb6c0)),
                 bVar6)) {
                local_4834 = local_4834 + 1;
              }
            }
            sprintf((char *)local_2408,"%i",(ulong)local_4834);
          }
          else {
            sprintf((char *)local_2408," ");
          }
          local_3620 = local_2408;
          break;
        case 'R':
          bVar6 = is_immortal(in_stack_ffffffffffffb6a8);
          if ((bVar6) && (local_8->in_room != (ROOM_INDEX_DATA *)0x0)) {
            sprintf((char *)local_2408,"%d",(ulong)(uint)(int)local_8->in_room->vnum);
          }
          else {
            sprintf((char *)local_2408," ");
          }
          local_3620 = local_2408;
          break;
        case 'V':
          sprintf((char *)local_2408,"%d",(ulong)(uint)(int)local_8->max_move);
          local_3620 = local_2408;
          break;
        case 'X':
          bVar6 = is_npc(in_stack_ffffffffffffb6a8);
          if (bVar6) {
            local_48e4 = 0;
          }
          else {
            sVar2 = local_8->level;
            iVar7 = exp_per_level(in_stack_ffffffffffffb6a8);
            local_48e4 = sVar2 * iVar7 - local_8->exp;
          }
          sprintf((char *)local_2408,"%d",(ulong)local_48e4);
          local_3620 = local_2408;
          break;
        case 'a':
          bVar6 = is_good(in_stack_ffffffffffffb6a8);
          if (bVar6) {
            local_48f8 = "good";
          }
          else {
            bVar6 = is_evil(in_stack_ffffffffffffb6a8);
            local_48f8 = "neutral";
            if (bVar6) {
              local_48f8 = "evil";
            }
          }
          sprintf((char *)local_2408,"%s",local_48f8);
          local_3620 = local_2408;
          break;
        case 'c':
          sprintf((char *)local_2408,"%s","\n\r");
          local_3620 = local_2408;
          break;
        case 'e':
          local_4835 = 0;
          local_4828[0] = '\0';
          for (local_486c = 0; local_486c < 6; local_486c = local_486c + 1) {
            local_4830 = local_8->in_room->exit[local_486c];
            if ((((local_4830 != (EXIT_DATA *)0x0) &&
                 ((local_4830->u1).to_room != (ROOM_INDEX_DATA *)0x0)) &&
                ((bVar6 = can_see_room((CHAR_DATA *)in_stack_ffffffffffffb6c8,
                                       (ROOM_INDEX_DATA *)
                                       CONCAT44(in_stack_ffffffffffffb6c4,in_stack_ffffffffffffb6c0)
                                      ), bVar6 &&
                 (uVar5 = local_4830->exit_info[0], _Var11 = std::pow<int,int>(0,0x5af306),
                 (uVar5 & (long)_Var11) == 0)))) &&
               ((uVar5 = local_4830->exit_info[0], _Var11 = std::pow<int,int>(0,0x5af33f),
                (uVar5 & (long)_Var11) == 0 ||
                (bVar6 = is_immortal(in_stack_ffffffffffffb6a8), bVar6)))) {
              local_4835 = 1;
              strcat(local_4828,(char *)local_4868[local_486c]);
            }
          }
          if (((local_4835 & 1) == 0) ||
             ((bVar6 = is_affected_by((CHAR_DATA *)in_stack_ffffffffffffb6b8,
                                      in_stack_ffffffffffffb6b4), bVar6 &&
              (bVar6 = is_immortal(in_stack_ffffffffffffb6a8), !bVar6)))) {
            strcat(local_1208,"none");
          }
          sprintf((char *)local_2408,"%s",local_4828);
          local_3620 = local_2408;
          break;
        case 'g':
          sprintf((char *)local_2408,"%ld",local_8->gold);
          local_3620 = local_2408;
          break;
        case 'h':
          uVar5 = local_8->comm[0];
          _Var11 = std::pow<int,int>(0,0x5af474);
          if ((uVar5 & (long)_Var11) == 0) {
            sprintf((char *)local_2408,"%d",(ulong)(uint)local_8->hit);
          }
          else {
            sprintf((char *)local_2408,"%d",(ulong)(uint)local_8->hit);
          }
          local_3620 = local_2408;
          break;
        case 'm':
          sprintf((char *)local_2408,"%d",(ulong)(uint)(int)local_8->mana);
          local_3620 = local_2408;
          break;
        case 'o':
          bVar6 = is_editing(local_8);
          if (bVar6) {
            ch_00 = local_2408;
            pcVar8 = olc_ed_name((CHAR_DATA *)
                                 CONCAT44(in_stack_ffffffffffffb6b4,in_stack_ffffffffffffb6b0));
            pcVar9 = olc_ed_vnum(ch_00);
            sprintf((char *)ch_00," (%s - %s)",pcVar8,pcVar9);
            local_3620 = local_2408;
          }
          break;
        case 'p':
          bVar6 = is_immortal(in_stack_ffffffffffffb6a8);
          if ((bVar6) && (local_8->in_room != (ROOM_INDEX_DATA *)0x0)) {
            local_4834 = 0;
            for (local_4878 = descriptor_list; local_4878 != (DESCRIPTOR_DATA *)0x0;
                local_4878 = local_4878->next) {
              if ((((local_4878->connected == 0) &&
                   (local_4878->character->in_room != (ROOM_INDEX_DATA *)0x0)) &&
                  (local_4878->character->in_room->area == local_8->in_room->area)) &&
                 (bVar6 = is_immortal(in_stack_ffffffffffffb6a8), !bVar6)) {
                local_4834 = local_4834 + 1;
              }
            }
            sprintf((char *)local_2408,"%i",(ulong)local_4834);
          }
          else {
            sprintf((char *)local_2408," ");
          }
          local_3620 = local_2408;
          break;
        case 'q':
          sprintf((char *)local_2408,"%d",(ulong)(uint)(int)local_8->pcdata->write_next);
          local_3620 = local_2408;
          break;
        case 'r':
          if (local_8->in_room == (ROOM_INDEX_DATA *)0x0) {
            sprintf((char *)local_2408," ");
          }
          else {
            bVar6 = is_npc(in_stack_ffffffffffffb6a8);
            if (((bVar6) ||
                (uVar5 = local_8->act[0], _Var11 = std::pow<int,int>(0,0x5af9c8),
                (uVar5 & (long)_Var11) == 0)) &&
               ((bVar6 = is_affected_by((CHAR_DATA *)in_stack_ffffffffffffb6b8,
                                        in_stack_ffffffffffffb6b4), bVar6 ||
                (bVar6 = room_is_dark((ROOM_INDEX_DATA *)in_stack_ffffffffffffb6a8), bVar6)))) {
              local_4910 = "darkness";
            }
            else {
              local_4910 = get_room_name((ROOM_INDEX_DATA *)in_stack_ffffffffffffb6a8);
            }
            sprintf((char *)local_2408,"%s",local_4910);
          }
          local_3620 = local_2408;
          break;
        case 't':
          if (time_info.hour % 0xc == 0) {
            in_stack_ffffffffffffb6c4 = 0xc;
          }
          else {
            in_stack_ffffffffffffb6c4 = time_info.hour % 0xc;
          }
          in_stack_ffffffffffffb6c8 = "";
          if ((time_info.half & 1U) != 0) {
            in_stack_ffffffffffffb6c8 = ":30";
          }
          if (time_info.hour < 0xc) {
            in_stack_ffffffffffffb6b8 = "am";
          }
          else {
            in_stack_ffffffffffffb6b8 = "pm";
          }
          in_stack_ffffffffffffb6d4 = in_stack_ffffffffffffb6c4;
          sprintf((char *)local_2408,"%d%s %s",(ulong)in_stack_ffffffffffffb6c4,
                  in_stack_ffffffffffffb6c8,in_stack_ffffffffffffb6b8);
          local_3620 = local_2408;
          break;
        case 'v':
          sprintf((char *)local_2408,"%d",(ulong)(uint)(int)local_8->move);
          local_3620 = local_2408;
          break;
        case 'x':
          sprintf((char *)local_2408,"%d",(ulong)(uint)local_8->exp);
          local_3620 = local_2408;
          break;
        case 'z':
          bVar6 = is_immortal(in_stack_ffffffffffffb6a8);
          if ((bVar6) && (local_8->in_room != (ROOM_INDEX_DATA *)0x0)) {
            sprintf((char *)local_2408,"%s",local_8->in_room->area->name);
          }
          else {
            sprintf((char *)local_2408," ");
          }
          local_3620 = local_2408;
        }
        local_3610 = local_3610 + 1;
        for (; cVar1 = *(char *)&local_3620->next, *local_3628 = cVar1, cVar1 != '\0';
            local_3620 = (CHAR_DATA *)((long)&local_3620->next + 1)) {
          local_3628 = local_3628 + 1;
        }
      }
      else {
        *local_3628 = *local_3610;
        local_3628 = local_3628 + 1;
        local_3610 = local_3610 + 1;
      }
    }
    write_to_buffer((DESCRIPTOR_DATA *)CONCAT44(in_stack_ffffffffffffb6d4,in_stack_ffffffffffffb6d0)
                    ,in_stack_ffffffffffffb6c8,in_stack_ffffffffffffb6c4);
  }
  return;
}

Assistant:

void bust_a_prompt(CHAR_DATA *ch)
{
	char buf[MAX_STRING_LENGTH];
	char buf2[MAX_STRING_LENGTH], buf3[MSL];
	/*const*/ char *str, *orig;
	const char *i = nullptr;
	char *point;
	char doors[MAX_INPUT_LENGTH];
	EXIT_DATA *pexit;
	int number_people;
	bool found;
	const char *dir_name[] = {"N", "E", "S", "W", "U", "D"};
	int door;
	DESCRIPTOR_DATA *d;
	point = buf;

	if (is_npc(ch)
		|| !str_cmp(ch->prompt, "")
		|| !str_cmp(ch->prompt, "<%hhp %mm %vmv> ")
		|| !str_cmp(ch->prompt, "<%hhp %mm %vmv>"))
	{
		sprintf(buf, "%s<%dhp %dm %dmv>%s ", get_char_color(ch, "prompt"), ch->hit, ch->mana, ch->move, END_COLOR(ch));
		send_to_char(buf, ch);
		return;
	}

	if (IS_SET(ch->comm, COMM_AFK))
		send_to_char("<AFK> ", ch);

	sprintf(buf2, "%s%s%s", get_char_color(ch, "prompt"), ch->prompt, END_COLOR(ch));
	strcpy(&buf3[0], &buf2[0]);
	orig = &buf3[0];
	str = orig;

	while (*str != '\0')
	{
		if (*str != '%')
		{
			*point++ = *str++;
			continue;
		}

		++str;

		switch (*str)
		{
			case 'e':
				found= false;
				doors[0] = '\0';

				for (door = 0; door < 6; door++)
				{
					if ((pexit = ch->in_room->exit[door]) != nullptr
						&& pexit->u1.to_room != nullptr
						&& can_see_room(ch, pexit->u1.to_room)
						&& !IS_SET(pexit->exit_info, EX_NONOBVIOUS)
						&& (!IS_SET(pexit->exit_info, EX_CLOSED) || is_immortal(ch)))
					{
						found = true;
						strcat(doors, dir_name[door]);
					}
				}

				if (!found || (is_affected_by(ch, AFF_BLIND) && !is_immortal(ch)))
					strcat(buf, "none");

				sprintf(buf2, "%s", doors);
				i = buf2;
				break;
			case 'c':
				sprintf(buf2, "%s", "\n\r");
				i = buf2;
				break;
			case 'h':
				if (!IS_SET(ch->comm, COMM_ANSI))
					sprintf(buf2, "%d", ch->hit);
				else
					sprintf(buf2, "%d", ch->hit);

				i = buf2;
				break;
			case 'H':
				sprintf(buf2, "%d", ch->max_hit);
				i = buf2;
				break;
			case 'm':
				sprintf(buf2, "%d", ch->mana);
				i = buf2;
				break;
			case 'M':
				sprintf(buf2, "%d", ch->max_mana);
				i = buf2;
				break;
			case 'L':
				if (ch->wait > 1)
					sprintf(buf2, "+");
				else
					sprintf(buf2, "-");

				i = buf2;
				break;
			case 'v':
				sprintf(buf2, "%d", ch->move);
				i = buf2;
				break;
			case 'V':
				sprintf(buf2, "%d", ch->max_move);
				i = buf2;
				break;
			case '1':
				if (ch->max_hit == 0)
					sprintf(buf2, "0%%");
				else
					sprintf(buf2, "%d%s", (100 * ch->hit) / ch->max_hit, "%");

				i = buf2;
				break;
			case '2':
				if (ch->max_mana == 0)
					sprintf(buf2, "0%%");
				else
					sprintf(buf2, "%d%s", (100 * ch->mana) / ch->max_mana, "%");

				i = buf2;
				break;
			case '3':
				if (ch->max_move == 0)
					sprintf(buf2, "0%%");
				else
					sprintf(buf2, "%d%s", (100 * ch->move) / ch->max_move, "%");

				i = buf2;
				break;
			case 'x':
				sprintf(buf2, "%d", ch->exp);
				i = buf2;
				break;
			case 'X':
				sprintf(buf2, "%d", is_npc(ch) ? 0 : ch->level * exp_per_level(ch) - ch->exp);
				i = buf2;
				break;
			case 'g':
				sprintf(buf2, "%ld", ch->gold);
				i = buf2;
				break;
			case 'a':
				sprintf(buf2, "%s", is_good(ch) ? "good" : is_evil(ch) ? "evil" : "neutral");
				i = buf2;
				break;
			case 'r':
				if (ch->in_room != nullptr)
				{
					sprintf(buf2, "%s",
						((!is_npc(ch) && IS_SET(ch->act, PLR_HOLYLIGHT))
							|| (!is_affected_by(ch, AFF_BLIND) && !room_is_dark(ch->in_room)))
								? get_room_name(ch->in_room)
								: "darkness");
				}
				else
				{
					sprintf(buf2, " ");
				}

				i = buf2;
				break;
			case 'R':
				if (is_immortal(ch) && ch->in_room != nullptr)
					sprintf(buf2, "%d", ch->in_room->vnum);
				else
					sprintf(buf2, " ");

				i = buf2;
				break;
			case 'z':
				if (is_immortal(ch) && ch->in_room != nullptr)
					sprintf(buf2, "%s", ch->in_room->area->name);
				else
					sprintf(buf2, " ");

				i = buf2;
				break;
			case 'p':
				if (is_immortal(ch) && ch->in_room != nullptr)
				{
					number_people = 0;

					for (d = descriptor_list; d != nullptr; d = d->next)
					{
						if (d->connected == CON_PLAYING
							&& d->character->in_room != nullptr
							&& d->character->in_room->area == ch->in_room->area
							&& !is_immortal(d->character))
						{
							number_people++;
						}
					}

					sprintf(buf2, "%i", number_people);
				}
				else
				{
					sprintf(buf2, " ");
				}

				i = buf2;
				break;
			case 'P':
				if (is_immortal(ch) && ch->in_room != nullptr)
				{
					number_people = 0;
					for (d = descriptor_list; d != nullptr; d = d->next)
					{
						if (d->connected == CON_PLAYING
							&& d->character->in_room != nullptr
							&& d->character->in_room->area == ch->in_room->area
							&& can_see(ch, d->character))
						{
							number_people++;
						}
					}

					sprintf(buf2, "%i", number_people);
				}
				else
				{
					sprintf(buf2, " ");
				}

				i = buf2;
				break;
			case 'C':
				if (is_immortal(ch))
				{
					number_people = 0;

					for (d = descriptor_list; d != nullptr; d = d->next)
					{
						if (d->connected == CON_PLAYING && can_see(ch, d->character))
							number_people++;
					}

					sprintf(buf2, "%i", number_people);
				}
				else
				{
					sprintf(buf2, " ");
				}

				i = buf2;
				break;
			case '%':
				sprintf(buf2, "%%");
				i = buf2;
				break;
			case 'o':
				if (is_editing(ch))
				{
					sprintf(buf2, " (%s - %s)", olc_ed_name(ch), olc_ed_vnum(ch));
					i = buf2;
				}
				break;
			case 't':
				sprintf(buf2, "%d%s %s",
					(time_info.hour % 12 == 0) ? 12 : time_info.hour % 12,
					time_info.half ? ":30" : "",
					(time_info.hour >= 12) ? "pm" : "am");

				i = buf2;
				break;
			case 'q':
				sprintf(buf2, "%d", ch->pcdata->write_next);
				i = buf2;
				break;
			default:
				i = " ";
				break;
		}

		++str;

		while ((*point = *i) != '\0')
		{
			++point, ++i;
		}
	}

	write_to_buffer(ch->desc, buf, point - buf);
	//   free_pstring(orig);
}